

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_wav_ds_seek(ma_data_source *pDataSource,ma_uint64 frameIndex)

{
  ma_bool32 mVar1;
  
  if (pDataSource != (ma_data_source *)0x0) {
    mVar1 = ma_dr_wav_seek_to_pcm_frame((ma_dr_wav *)((long)pDataSource + 0x70),frameIndex);
    return -(uint)(mVar1 != 1);
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_wav_seek_to_pcm_frame(ma_wav* pWav, ma_uint64 frameIndex)
{
    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_WAV)
    {
        ma_bool32 wavResult;

        wavResult = ma_dr_wav_seek_to_pcm_frame(&pWav->dr, frameIndex);
        if (wavResult != MA_TRUE) {
            return MA_ERROR;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)frameIndex;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}